

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  undefined1 auVar1 [20];
  uint uVar2;
  size_t sVar3;
  void *__dest;
  U32 *pUVar4;
  undefined4 in_stack_fffffffffffffee4;
  ZSTD_strategy in_stack_fffffffffffffee8;
  size_t err_code_1;
  size_t dictID;
  ZSTD_CCtx_params params;
  size_t err_code;
  void *internalBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  ZSTD_CDict *cdict_local;
  
  auVar1 = cParams._8_20_;
  cParams_00.targetLength = in_stack_fffffffffffffee4;
  cParams_00.windowLog = auVar1._0_4_;
  cParams_00.chainLog = auVar1._4_4_;
  cParams_00.hashLog = auVar1._8_4_;
  cParams_00.searchLog = auVar1._12_4_;
  cParams_00.minMatch = auVar1._16_4_;
  cParams_00.strategy = in_stack_fffffffffffffee8;
  sVar3 = ZSTD_checkCParams(cParams_00);
  if (sVar3 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3742,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                 );
  }
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = cParams.hashLog;
  (cdict->matchState).cParams.searchLog = cParams.searchLog;
  (cdict->matchState).cParams.minMatch = cParams.minMatch;
  (cdict->matchState).cParams.targetLength = cParams.targetLength;
  (cdict->matchState).cParams.strategy = cParams.strategy;
  if (((dictLoadMethod == ZSTD_dlm_byRef) || (dictBuffer == (void *)0x0)) || (dictSize == 0)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    sVar3 = ZSTD_cwksp_align(dictSize,8);
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,sVar3);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  pUVar4 = (U32 *)ZSTD_cwksp_reserve_object(&cdict->workspace,0x1800);
  cdict->entropyWorkspace = pUVar4;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  params.customMem.opaque =
       (void *)ZSTD_reset_matchState
                         (&cdict->matchState,&cdict->workspace,&cParams,ZSTDcrp_makeClean,
                          ZSTDirp_reset,ZSTD_resetTarget_CDict);
  uVar2 = ERR_isError((size_t)params.customMem.opaque);
  if (uVar2 == 0) {
    memset(&dictID,0,0x90);
    params.fParams.checksumFlag = 3;
    params.cParams.targetLength = 1;
    dictID._4_4_ = cParams.windowLog;
    unique0x00012004 = cParams.chainLog;
    params.cParams.windowLog = cParams.hashLog;
    params.cParams.chainLog = cParams.searchLog;
    params.cParams.hashLog = cParams.minMatch;
    params.cParams.searchLog = cParams.targetLength;
    params.cParams.minMatch = cParams.strategy;
    cdict_local = (ZSTD_CDict *)
                  ZSTD_compress_insertDictionary
                            (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,
                             &cdict->workspace,(ZSTD_CCtx_params *)&dictID,cdict->dictContent,
                             cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                             cdict->entropyWorkspace);
    uVar2 = ERR_isError((size_t)cdict_local);
    if (uVar2 == 0) {
      if ((ZSTD_CDict *)0xffffffff < cdict_local) {
        __assert_fail("dictID <= (size_t)(U32)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3767,
                      "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                     );
      }
      cdict->dictID = (U32)cdict_local;
      cdict_local = (ZSTD_CDict *)0x0;
    }
  }
  else {
    cdict_local = (ZSTD_CDict *)params.customMem.opaque;
  }
  return (size_t)cdict_local;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation);
        cdict->dictContent = internalBuffer;
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &cParams,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict));
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID);
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}